

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

bool __thiscall diy::Direction::operator<(Direction *this,Direction *y)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar3 = (this->super_DynamicPoint<int,_4UL>).
           super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  uVar4 = (ulong)((long)(this->super_DynamicPoint<int,_4UL>).
                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end - (long)piVar3
                 ) >> 2 & 0xffffffff;
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    uVar6 = uVar5;
    if (uVar4 == uVar5) goto LAB_0014202c;
    iVar1 = piVar3[uVar5];
    iVar2 = (y->super_DynamicPoint<int,_4UL>).
            super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[uVar5];
    if (iVar1 < iVar2) {
      uVar6 = 1;
      goto LAB_0014202c;
    }
    uVar6 = uVar5 + 1;
  } while (iVar1 <= iVar2);
  uVar6 = 0;
LAB_0014202c:
  return (bool)(uVar5 < uVar4 & (byte)uVar6);
}

Assistant:

bool
      operator<(const diy::Direction& y) const
      {
        for (size_t i = 0; i < dimension(); ++i)
        {
            if ((*this)[i] < y[i]) return true;
            if ((*this)[i] > y[i]) return false;
        }
        return false;
      }